

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

bool __thiscall
caffe::NetStateRule::MergePartialFromCodedStream(NetStateRule *this,CodedInputStream *input)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  byte bVar1;
  byte *pbVar2;
  char *pcVar3;
  RepeatedPtrFieldBase *this_01;
  bool bVar4;
  uint32 uVar5;
  UnknownFieldSet *pUVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  Type *pTVar8;
  int32 *value_00;
  char cVar9;
  uint tag;
  ulong uVar10;
  int value;
  int32 *local_48;
  int32 *local_40;
  RepeatedPtrFieldBase *local_38;
  
  local_38 = &(this->not_stage_).super_RepeatedPtrFieldBase;
  this_00 = &this->stage_;
  local_40 = &this->max_level_;
  local_48 = &this->min_level_;
LAB_0048df0e:
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_0048df32;
      input->buffer_ = pbVar2 + 1;
      uVar10 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_0048df32:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar10 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar10 = 0x100000000;
      }
      uVar10 = uVar5 | uVar10;
    }
    this_01 = local_38;
    tag = (uint)uVar10;
    if ((uVar10 & 0x100000000) == 0) goto switchD_0048dfa1_default;
    cVar9 = (char)uVar10;
    switch((uint)(uVar10 >> 3) & 0x1fffffff) {
    case 1:
      if (cVar9 == '\b') {
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                          (input,&value);
        if (!bVar4) {
          return false;
        }
        if ((uint)value < 2) {
          set_phase(this,value);
        }
        else {
          pUVar6 = mutable_unknown_fields(this);
          google::protobuf::UnknownFieldSet::AddVarint(pUVar6,1,(long)value);
        }
        goto LAB_0048df0e;
      }
      break;
    case 2:
      if (cVar9 != '\x10') break;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      value_00 = local_48;
LAB_0048e0c3:
      bVar4 = google::protobuf::internal::WireFormatLite::
              ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                        (input,value_00);
      goto LAB_0048df84;
    case 3:
      if (cVar9 == '\x18') {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
        value_00 = local_40;
        goto LAB_0048e0c3;
      }
      break;
    case 4:
      if (cVar9 == '\"') {
        pbVar7 = google::protobuf::
                 RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::Add(this_00);
        bVar4 = google::protobuf::internal::WireFormatLite::ReadBytes(input,pbVar7);
        if (!bVar4) {
          return false;
        }
        pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                           (&this_00->super_RepeatedPtrFieldBase,
                            (this->stage_).super_RepeatedPtrFieldBase.current_size_ + -1);
        pcVar3 = (pTVar8->_M_dataplus)._M_p;
        pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                           (&this_00->super_RepeatedPtrFieldBase,
                            (this->stage_).super_RepeatedPtrFieldBase.current_size_ + -1);
        google::protobuf::internal::WireFormatLite::VerifyUtf8String
                  (pcVar3,(int)pTVar8->_M_string_length,PARSE,"caffe.NetStateRule.stage");
        goto LAB_0048df0e;
      }
      break;
    case 5:
      if (cVar9 == '*') {
        pbVar7 = google::protobuf::
                 RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::Add((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_38);
        bVar4 = google::protobuf::internal::WireFormatLite::ReadBytes(input,pbVar7);
        if (!bVar4) {
          return false;
        }
        pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                           (this_01,(this->not_stage_).super_RepeatedPtrFieldBase.current_size_ + -1
                           );
        pcVar3 = (pTVar8->_M_dataplus)._M_p;
        pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                           (this_01,(this->not_stage_).super_RepeatedPtrFieldBase.current_size_ + -1
                           );
        google::protobuf::internal::WireFormatLite::VerifyUtf8String
                  (pcVar3,(int)pTVar8->_M_string_length,PARSE,"caffe.NetStateRule.not_stage");
        goto LAB_0048df0e;
      }
    }
switchD_0048dfa1_default:
    if (tag == 0) {
      return true;
    }
    if ((tag & 7) == 4) {
      return true;
    }
    pUVar6 = mutable_unknown_fields(this);
    bVar4 = google::protobuf::internal::WireFormat::SkipField(input,tag,pUVar6);
LAB_0048df84:
    if (bVar4 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool NetStateRule::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.NetStateRule)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional .caffe.Phase phase = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::caffe::Phase_IsValid(value)) {
            set_phase(static_cast< ::caffe::Phase >(value));
          } else {
            mutable_unknown_fields()->AddVarint(1, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional int32 min_level = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          set_has_min_level();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &min_level_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional int32 max_level = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {
          set_has_max_level();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &max_level_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated string stage = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->add_stage()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->stage(this->stage_size() - 1).data(),
            this->stage(this->stage_size() - 1).length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.NetStateRule.stage");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated string not_stage = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(42u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->add_not_stage()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->not_stage(this->not_stage_size() - 1).data(),
            this->not_stage(this->not_stage_size() - 1).length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.NetStateRule.not_stage");
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.NetStateRule)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.NetStateRule)
  return false;
#undef DO_
}